

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapPerm.c
# Opt level: O3

int Amap_LibDeriveGatePerm
              (Amap_Lib_t *pLib,Amap_Gat_t *pGate,Kit_DsdNtk_t *pNtk,Amap_Nod_t *pNod,char *pArray)

{
  uint uVar1;
  char cVar2;
  Vec_Int_t *__ptr;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int *__ptr_00;
  ulong uVar9;
  
  __ptr = Amap_LibDeriveGatePerm_rec(pLib,pNtk,pNtk->Root & 0xfffffffe,pNod);
  if (__ptr == (Vec_Int_t *)0x0) {
    iVar8 = 0;
  }
  else {
    uVar3 = (ulong)(uint)__ptr->nSize;
    if (__ptr->nSize != (uint)(byte)pNod->field_0x2) {
      __assert_fail("Vec_IntSize(vPerm) == (int)pNod->nSuppSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapPerm.c"
                    ,0x156,
                    "int Amap_LibDeriveGatePerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, char *)"
                   );
    }
    if (uVar3 != 0) {
      __ptr_00 = __ptr->pArray;
      uVar4 = 1;
      uVar6 = 0;
      do {
        uVar7 = uVar6 + 1;
        if (uVar7 < uVar3) {
          uVar9 = uVar4;
          if (__ptr_00[uVar6] < 0) {
LAB_008bdf9e:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          do {
            if (__ptr_00[uVar9] < 0) goto LAB_008bdf9e;
            if ((uint)(__ptr_00[uVar9] ^ __ptr_00[uVar6]) < 2) {
              iVar8 = 0;
              goto LAB_008bdf84;
            }
            uVar9 = uVar9 + 1;
          } while (uVar3 != uVar9);
        }
        uVar4 = uVar4 + 1;
        uVar6 = uVar7;
      } while (uVar7 != uVar3);
      if (uVar3 != 0) {
        cVar2 = '\0';
        lVar5 = 0;
        do {
          uVar1 = __ptr->pArray[lVar5];
          if (SBORROW4(uVar1,(uint)(byte)pNod->field_0x2 * 2) ==
              (int)(uVar1 + (uint)(byte)pNod->field_0x2 * -2) < 0) {
            __assert_fail("Entry < 2 * (int)pNod->nSuppSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapPerm.c"
                          ,0x162,
                          "int Amap_LibDeriveGatePerm(Amap_Lib_t *, Amap_Gat_t *, Kit_DsdNtk_t *, Amap_Nod_t *, char *)"
                         );
          }
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          pArray[uVar1 >> 1] = ((byte)uVar1 & 1) + cVar2;
          lVar5 = lVar5 + 1;
          cVar2 = cVar2 + '\x02';
        } while (lVar5 < __ptr->nSize);
      }
    }
    __ptr_00 = __ptr->pArray;
    iVar8 = 1;
    if (__ptr_00 != (int *)0x0) {
LAB_008bdf84:
      free(__ptr_00);
    }
    free(__ptr);
  }
  return iVar8;
}

Assistant:

int Amap_LibDeriveGatePerm( Amap_Lib_t * pLib, Amap_Gat_t * pGate, Kit_DsdNtk_t * pNtk, Amap_Nod_t * pNod, char * pArray )
{
    int fVerbose = 0;
    Vec_Int_t * vPerm;
    int Entry, Entry2, i, k;
//    Kit_DsdPrint( stdout, pNtk );

    vPerm = Amap_LibDeriveGatePerm_rec( pLib, pNtk, Abc_LitRegular(pNtk->Root), pNod );
    if ( vPerm == NULL )
        return 0;
    // check that the permutation is valid
    assert( Vec_IntSize(vPerm) == (int)pNod->nSuppSize );
    Vec_IntForEachEntry( vPerm, Entry, i )
        Vec_IntForEachEntryStart( vPerm, Entry2, k, i+1 )
            if ( Abc_Lit2Var(Entry) == Abc_Lit2Var(Entry2) )
            {
                Vec_IntFree( vPerm );
                return 0;
            }

    // reverse the permutation
    Vec_IntForEachEntry( vPerm, Entry, i )
    {
        assert( Entry < 2 * (int)pNod->nSuppSize );
        pArray[Abc_Lit2Var(Entry)] = Abc_Var2Lit( i, Abc_LitIsCompl(Entry) );
//        pArray[i] = Entry;
//printf( "%d=%d%c ", Abc_Lit2Var(Entry), i, Abc_LitIsCompl(Entry)?'-':'+' );
    }
//printf( "\n" );
//    if ( Kit_DsdNonDsdSizeMax(pNtk) < 3 )
//        Amap_LibVerifyPerm( pLib, pGate, pNtk, pNod, Vec_IntArray(vPerm) );
    Vec_IntFree( vPerm );
    // print the result
    if ( fVerbose )
    {
    printf( "node %4d : ", pNod->Id );
    for ( i = 0; i < (int)pNod->nSuppSize; i++ )
        printf( "%d=%d%c ", i, Abc_Lit2Var(pArray[i]), Abc_LitIsCompl(pArray[i])?'-':'+' );
    printf( "\n" );
    }
    return 1;
}